

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86IMUL(uchar *stream,x86Reg srcdst,int num)

{
  uchar *puVar1;
  uchar uVar2;
  byte bVar3;
  int iVar4;
  
  if ((char)(uchar)num == num) {
    bVar3 = (8 < (int)srcdst) * '\x04' | 8 < (int)srcdst;
    if (bVar3 != 0) {
      *stream = bVar3 | 0x40;
    }
    puVar1 = stream + (bVar3 != 0);
    iVar4 = (int)puVar1 + 3;
    *puVar1 = 'k';
    uVar2 = encodeRegister(srcdst,regCode[srcdst]);
    puVar1[1] = uVar2;
    puVar1[2] = (uchar)num;
  }
  else {
    bVar3 = (8 < (int)srcdst) * '\x04' | 8 < (int)srcdst;
    if (bVar3 != 0) {
      *stream = bVar3 | 0x40;
    }
    puVar1 = stream + (bVar3 != 0);
    iVar4 = (int)puVar1 + 6;
    *puVar1 = 'i';
    uVar2 = encodeRegister(srcdst,regCode[srcdst]);
    puVar1[1] = uVar2;
    *(int *)(puVar1 + 2) = num;
  }
  return iVar4 - (int)stream;
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg srcdst, int num)
{
	unsigned char *start = stream;

	if((char)(num) == num)
	{
		stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
		*stream++ = 0x6b;
		*stream++ = encodeRegister(srcdst, regCode[srcdst]);
		stream += encodeImmByte(stream, (char)num);

		return int(stream - start);
	}

	stream += encodeRex(stream, false, srcdst, rNONE, srcdst);
	*stream++ = 0x69;
	*stream++ = encodeRegister(srcdst, regCode[srcdst]);
	stream += encodeImmDword(stream, num);

	return int(stream - start);
}